

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_ReadSharedArrayBuffer(BCReaderState *s)

{
  JSValue obj_00;
  JSValue v;
  JSValue JVar1;
  int iVar2;
  undefined8 *in_RDI;
  JSValue JVar3;
  JSFreeArrayBufferDataFunc *in_stack_00000010;
  void *in_stack_00000018;
  BOOL in_stack_00000020;
  uint64_t u64;
  JSValue obj;
  uint8_t *data_ptr;
  uint32_t byte_length;
  JSContext *ctx;
  BCReaderState *in_stack_ffffffffffffff78;
  JSValueUnion JVar4;
  uint32_t *in_stack_ffffffffffffff80;
  JSContext *ctx_00;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int64_t in_stack_ffffffffffffff90;
  int64_t local_50;
  undefined8 local_48;
  uint8_t *in_stack_ffffffffffffffc8;
  uint64_t in_stack_ffffffffffffffd8;
  JSContext *ctx_01;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffff4;
  int64_t local_8;
  
  ctx_01 = (JSContext *)*in_RDI;
  iVar2 = bc_get_leb128((BCReaderState *)
                        CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                        in_stack_ffffffffffffff80);
  if (iVar2 == 0) {
    iVar2 = bc_get_u64(in_stack_ffffffffffffff78,(uint64_t *)0x16ddc5);
    if (iVar2 == 0) {
      JVar4.float64 = 0.0;
      ctx_00 = (JSContext *)0x0;
      uVar5 = 0;
      JVar3.tag._0_4_ = in_stack_fffffffffffffff0;
      JVar3.u.ptr = in_RDI;
      JVar3.tag._4_4_ = in_stack_fffffffffffffff4;
      JVar3 = js_array_buffer_constructor3
                        (ctx_01,JVar3,in_stack_ffffffffffffffd8,(JSClassID)((ulong)local_48 >> 0x20)
                         ,in_stack_ffffffffffffffc8,in_stack_00000010,in_stack_00000018,
                         in_stack_00000020);
      local_50 = JVar3.tag;
      iVar2 = JS_IsException(JVar3);
      if ((iVar2 == 0) &&
         (obj_00.tag = (int64_t)ctx_00, obj_00.u.float64 = JVar4.float64,
         iVar2 = BC_add_object_ref((BCReaderState *)0x16de88,obj_00), iVar2 == 0)) {
        uVar5 = JVar3.u._0_4_;
        in_stack_fffffffffffffff4 = JVar3.u._4_4_;
        local_8 = local_50;
      }
      else {
        v.u._4_4_ = in_stack_ffffffffffffff8c;
        v.u.int32 = uVar5;
        v.tag = in_stack_ffffffffffffff90;
        JS_FreeValue(ctx_00,v);
        uVar5 = 0;
        local_8 = 6;
      }
    }
    else {
      uVar5 = 0;
      local_8 = 6;
    }
  }
  else {
    uVar5 = 0;
    local_8 = 6;
  }
  JVar1.u._4_4_ = in_stack_fffffffffffffff4;
  JVar1.u.int32 = uVar5;
  JVar1.tag = local_8;
  return JVar1;
}

Assistant:

static JSValue JS_ReadSharedArrayBuffer(BCReaderState *s)
{
    JSContext *ctx = s->ctx;
    uint32_t byte_length;
    uint8_t *data_ptr;
    JSValue obj;
    uint64_t u64;
    
    if (bc_get_leb128(s, &byte_length))
        return JS_EXCEPTION;
    if (bc_get_u64(s, &u64))
        return JS_EXCEPTION;
    data_ptr = (uint8_t *)(uintptr_t)u64;
    /* the SharedArrayBuffer is cloned */
    obj = js_array_buffer_constructor3(ctx, JS_UNDEFINED, byte_length,
                                       JS_CLASS_SHARED_ARRAY_BUFFER,
                                       data_ptr,
                                       NULL, NULL, FALSE);
    if (JS_IsException(obj))
        goto fail;
    if (BC_add_object_ref(s, obj))
        goto fail;
    return obj;
 fail:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}